

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.hpp
# Opt level: O2

void __thiscall
ot::commissioner::Timer::Timer(Timer *this,event_base *aEventBase,Action *aAction,bool aIsSingle)

{
  int iVar1;
  
  (this->mFireTime).__d.__r = 0;
  std::function<void_(ot::commissioner::Timer_&)>::function(&this->mAction,aAction);
  this->mIsSingle = aIsSingle;
  this->mEnabled = false;
  iVar1 = event_assign(&this->mTimerEvent,aEventBase,-1,(ushort)!aIsSingle << 4,HandleEvent,this);
  if (iVar1 == 0) {
    return;
  }
  abort();
}

Assistant:

Timer(struct event_base *aEventBase, Action aAction, bool aIsSingle = true)
        : mAction(aAction)
        , mIsSingle(aIsSingle)
        , mEnabled(false)
    {
        int flags = mIsSingle ? 0 : EV_PERSIST;

        VerifyOrDie(event_assign(&mTimerEvent, aEventBase, -1, flags, HandleEvent, this) == 0);
    }